

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  wchar_t wVar14;
  ulong uVar15;
  size_t sVar16;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  wchar_t zero;
  significand_type significand;
  int exp;
  digit_grouping<wchar_t> grouping;
  anon_class_32_8_b693abdd write;
  wchar_t local_e8;
  wchar_t local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  digit_grouping<wchar_t> local_c0;
  basic_format_specs<wchar_t> *local_98;
  long local_90;
  decimal_fp<float> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  wchar_t wStack_6c;
  undefined4 local_68;
  wchar_t wStack_64;
  decimal_fp<float> *local_60;
  digit_grouping<wchar_t> *local_58;
  digit_grouping<wchar_t> *local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  
  uVar1 = fp->significand;
  uVar3 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar9 = (ulong)uVar1 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar3 * 8);
  uVar15 = uVar9 >> 0x20;
  wVar6 = (wchar_t)(uVar9 >> 0x20);
  local_e0._8_4_ = 0x30;
  uVar3 = fspecs._4_4_;
  local_e0._4_4_ = uVar3 >> 8 & 0xff;
  local_e4 = wVar6;
  local_e0._12_4_ = uVar1;
  local_80 = (undefined1  [8])fspecs;
  if ((long)uVar9 < 0) {
LAB_00176726:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  lVar13 = (uVar15 + 1) - (ulong)(local_e0._4_4_ == 0);
  local_e0._0_4_ = L'.';
  if ((uVar3 >> 0x11 & 1) != 0) {
    local_d0._0_8_ = out.container;
    local_98 = specs;
    local_90 = lVar13;
    local_88 = fp;
    local_e0._0_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
    specs = local_98;
    out.container = (buffer<wchar_t> *)local_d0._0_8_;
    fp = local_88;
    lVar13 = local_90;
  }
  uVar2 = fp->exponent;
  local_d0._12_4_ = uVar2 + wVar6;
  wVar14 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00176461:
    iVar7 = uVar2 + wVar6 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar9 = 0;
      if (wVar6 == L'\x01') {
        local_e0._0_4_ = L'\0';
        uVar9 = 0;
      }
    }
    else {
      uVar9 = 0;
      if (0 < wVar14 - wVar6) {
        uVar9 = (ulong)(uint)(wVar14 - wVar6);
      }
      lVar13 = lVar13 + uVar9;
    }
    local_78._0_8_ = CONCAT44(uVar1,uVar3 >> 8) & 0xffffffff000000ff;
    wStack_6c = local_e0._0_4_;
    local_78._8_4_ = wVar6;
    local_68 = (undefined4)uVar9;
    wStack_64 = L'0';
    local_60 = (decimal_fp<float> *)
               (CONCAT44(iVar7,(int)CONCAT71(local_60._1_7_,((uVar3 >> 0x10 & 1) == 0) << 5)) | 0x45
               );
    if (0 < specs->width) {
      if ((int)local_d0._12_4_ < L'\x01') {
        iVar7 = 1 - local_d0._12_4_;
      }
      lVar4 = 2;
      if (99 < iVar7) {
        lVar4 = (ulong)(999 < iVar7) + 3;
      }
      sVar16 = lVar13 + (3 - (ulong)(local_e0._0_4_ == L'\0')) + lVar4;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar16,sVar16,(anon_class_32_8_b693abdd *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
    }
    bVar5 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
            ::anon_class_32_8_b693abdd::operator()
                      ((anon_class_32_8_b693abdd *)local_78,out.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    wVar8 = L'\x10';
    if (L'\0' < wVar14) {
      wVar8 = wVar14;
    }
    if (((int)local_d0._12_4_ < L'\xfffffffd') || (wVar8 < (int)local_d0._12_4_)) goto LAB_00176461;
  }
  if ((int)uVar2 < 0) {
    if ((int)local_d0._12_4_ < L'\x01') {
      wVar6 = -local_d0._12_4_;
      local_c0.sep_.grouping._M_dataplus._M_p._0_4_ = wVar6;
      if (SBORROW4(wVar14,wVar6) != wVar14 + local_d0._12_4_ < 0) {
        local_c0.sep_.grouping._M_dataplus._M_p._0_4_ = wVar14;
      }
      if (wVar14 < L'\0') {
        local_c0.sep_.grouping._M_dataplus._M_p._0_4_ = wVar6;
      }
      if (uVar15 != 0) {
        local_c0.sep_.grouping._M_dataplus._M_p._0_4_ = wVar6;
      }
      if ((wchar_t)local_c0.sep_.grouping._M_dataplus._M_p == L'\0' && uVar15 == 0) {
        local_e8 = CONCAT31(local_e8._1_3_,(char)((uVar3 & 0x100000) >> 0x14));
        iVar7 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_e8 = CONCAT31(local_e8._1_3_,1);
        iVar7 = 2;
        if ((wchar_t)local_c0.sep_.grouping._M_dataplus._M_p < L'\0') goto LAB_00176726;
      }
      sVar16 = lVar13 + (ulong)(uint)(iVar7 + (wchar_t)local_c0.sep_.grouping._M_dataplus._M_p);
      local_78._0_8_ = local_e0 + 4;
      unique0x00004e80 = local_e0 + 8;
      local_60 = (decimal_fp<float> *)local_e0;
      local_58 = &local_c0;
      local_50 = (digit_grouping<wchar_t> *)(local_e0 + 0xc);
      local_48 = &local_e4;
      _local_68 = &local_e8;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                        (out,specs,sVar16,sVar16,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
    }
    wVar8 = L'\0';
    local_e8 = wVar14 - wVar6 & (int)(uVar3 << 0xb) >> 0x1f;
    wVar6 = local_e8;
    if (local_e8 < L'\x01') {
      wVar6 = L'\0';
    }
    local_d0._0_8_ = out.container;
    digit_grouping<wchar_t>::digit_grouping(&local_c0,loc,(bool)((byte)(uVar3 >> 0x11) & 1));
    if (local_c0.sep_.thousands_sep != L'\0') {
      pcVar11 = (char *)CONCAT44(local_c0.sep_.grouping._M_dataplus._M_p._4_4_,
                                 (wchar_t)local_c0.sep_.grouping._M_dataplus._M_p);
      pcVar12 = pcVar11 + local_c0.sep_.grouping._M_string_length;
      lVar4 = 0;
      do {
        if (pcVar11 == pcVar12) {
          cVar10 = pcVar12[-1];
          pcVar11 = pcVar12;
        }
        else {
          cVar10 = *pcVar11;
          if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00176740;
          pcVar11 = pcVar11 + 1;
        }
        wVar8 = wVar8 + cVar10;
        if (local_e4 <= wVar8) goto LAB_00176740;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_00176740:
    sVar16 = lVar13 + (ulong)(uint)wVar6 + 1 + lVar4;
    local_78._0_8_ = local_e0 + 4;
    unique0x00004e80 = local_e0 + 0xc;
    _local_68 = &local_e4;
    local_60 = (decimal_fp<float> *)(local_d0 + 0xc);
    local_58 = (digit_grouping<wchar_t> *)local_e0;
    local_40 = (wchar_t *)(local_e0 + 8);
    local_50 = &local_c0;
    local_48 = &local_e8;
    bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_d0._0_8_,specs
                       ,sVar16,sVar16,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_0017679b;
  }
  lVar13 = lVar13 + (ulong)uVar2;
  local_e8 = wVar14 - local_d0._12_4_;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || L'\0' < local_e8) {
      if (local_e8 < L'\x01') goto LAB_0017661c;
    }
    else {
      local_e8 = L'\x01';
    }
    lVar13 = lVar13 + (ulong)(uint)local_e8 + 1;
  }
LAB_0017661c:
  digit_grouping<wchar_t>::digit_grouping(&local_c0,loc,(bool)((byte)(uVar3 >> 0x11) & 1));
  wVar6 = L'\0';
  if (local_c0.sep_.thousands_sep != L'\0') {
    pcVar11 = (char *)CONCAT44(local_c0.sep_.grouping._M_dataplus._M_p._4_4_,
                               (wchar_t)local_c0.sep_.grouping._M_dataplus._M_p);
    pcVar12 = pcVar11 + local_c0.sep_.grouping._M_string_length;
    lVar4 = 0;
    do {
      if (pcVar11 == pcVar12) {
        cVar10 = pcVar12[-1];
        pcVar11 = pcVar12;
      }
      else {
        cVar10 = *pcVar11;
        if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00176689;
        pcVar11 = pcVar11 + 1;
      }
      wVar6 = wVar6 + cVar10;
      if (local_e4 <= wVar6) goto LAB_00176689;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 0;
LAB_00176689:
  local_78._0_8_ = local_e0 + 4;
  unique0x00004e80 = local_e0 + 0xc;
  _local_68 = &local_e4;
  local_50 = (digit_grouping<wchar_t> *)local_80;
  local_48 = (wchar_t *)local_e0;
  local_38 = (wchar_t *)(local_e0 + 8);
  local_60 = fp;
  local_58 = &local_c0;
  local_40 = &local_e8;
  bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                    (out,specs,lVar13 + lVar4,lVar13 + lVar4,(anon_class_72_9_d68ba176 *)local_78);
LAB_0017679b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_c0.sep_.grouping._M_dataplus._M_p._4_4_,
                  (wchar_t)local_c0.sep_.grouping._M_dataplus._M_p) !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c0.sep_.grouping + 0x10U)) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_c0.sep_.grouping._M_dataplus._M_p._4_4_,
                                (wchar_t)local_c0.sep_.grouping._M_dataplus._M_p),
                    local_c0.sep_.grouping.field_2._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}